

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

HyperParam * xLearn::Init(void)

{
  HyperParam *in_RDI;
  HyperParam *hyper_param;
  HyperParam *in_stack_00000080;
  HyperParam *pHVar1;
  
  pHVar1 = in_RDI;
  HyperParam::HyperParam(in_stack_00000080);
  std::__cxx11::string::operator=((string *)&in_RDI->score_func,"ffm");
  std::__cxx11::string::operator=((string *)&in_RDI->loss_func,"squared");
  in_RDI->num_feature = 4;
  in_RDI->num_K = 4;
  in_RDI->auxiliary_size = 2;
  in_RDI->num_field = 4;
  std::__cxx11::string::operator=((string *)&in_RDI->model_file,"./test_model.bin");
  return pHVar1;
}

Assistant:

HyperParam Init() {
  HyperParam hyper_param;
  hyper_param.score_func = "ffm";
  hyper_param.loss_func = "squared";
  hyper_param.num_feature = 4;
  hyper_param.num_K = 4;
  hyper_param.auxiliary_size = 2;
  hyper_param.num_field = 4;
  hyper_param.model_file = "./test_model.bin";
  return hyper_param;
}